

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolTCP.cpp
# Opt level: O3

uint16_t __thiscall ProtocolTCP::NewPort(ProtocolTCP *this)

{
  ushort uVar1;
  int iVar3;
  int iVar4;
  uint16_t uVar2;
  
  uVar1 = 0x400;
  if (0x400 < this->NextPort) {
    uVar1 = this->NextPort;
  }
  uVar2 = uVar1 + 1;
  this->NextPort = uVar2;
  iVar3 = 0;
  do {
    iVar4 = iVar3;
    if (*(uint16_t *)(&this->field_0x4 + (long)iVar3 * 0x370) == uVar2) {
      uVar2 = uVar2 + 1;
      this->NextPort = uVar2;
      iVar4 = -1;
    }
    iVar3 = iVar4 + 1;
  } while (iVar4 < 4);
  return uVar2;
}

Assistant:

uint16_t ProtocolTCP::NewPort()
{
    int i;

    if (NextPort <= 1024)
    {
        NextPort = 1024;
    }

    NextPort++;

    for (i = 0; i < TCP_MAX_CONNECTIONS; i++)
    {
        if (ConnectionList[i].LocalPort == NextPort)
        {
            NextPort++;
            i = -1;
        }
    }

    return NextPort;
}